

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mt.c
# Opt level: O3

bool_t mtCallOnce(size_t *once,_func_void_varargs *fn)

{
  size_t sVar1;
  
  do {
    LOCK();
    sVar1 = *once;
    if (sVar1 == 0) {
      *once = 0xffffffffffffffff;
      sVar1 = 0;
    }
    UNLOCK();
  } while (sVar1 == 0xffffffffffffffff);
  if (sVar1 == 0) {
    (*fn)();
    *once = 1;
  }
  return 1;
}

Assistant:

bool_t mtCallOnce(size_t* once, void (*fn)())
{
	size_t t;
	// попытки вызова
	do
		// удается захватить триггер?...
		if ((t = mtAtomicCmpSwap(once, 0, SIZE_MAX)) == 0)
		{
			// ... да, обработать захват
			fn(), *once = 1;
			break;
		}
	// ... нет, ожидаем обработки захвата в другом потоке
	while (t == SIZE_MAX);
	// завершить
	ASSERT(*once == 1);
	return TRUE;
}